

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool valid_rep(cs_struct *h,uint opcode)

{
  unsigned_short uVar1;
  uint uVar2;
  int in_ESI;
  int i;
  uint id;
  unsigned_short **in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = insn_find((insn_map *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
                    ,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (uVar1 == 0) {
    return false;
  }
  uVar2 = (uint)insns[(int)(uint)uVar1].mapid;
  if (((uVar2 != 0xd8) && (1 < uVar2 - 0xdb)) && (uVar2 != 0x14f)) {
    if (uVar2 == 0x150) {
      if (in_ESI == 0x531) {
        return true;
      }
      return false;
    }
    if ((1 < uVar2 - 0x151) && (uVar2 != 0x1d6)) {
      if (uVar2 == 0x1d7) {
        if (in_ESI == 0x6ce) {
          return true;
        }
        return false;
      }
      if (((uVar2 != 0x1da) && (uVar2 != 0x1dc)) && ((2 < uVar2 - 0x1f1 && (uVar2 != 0x2a3)))) {
        if (uVar2 == 0x2a4) {
          if (in_ESI == 0xaf0) {
            return true;
          }
          return false;
        }
        if (1 < uVar2 - 0x2a5) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool valid_rep(cs_struct *h, unsigned int opcode)
{
	unsigned int id;
	int i = insn_find(insns, ARR_SIZE(insns), opcode, &h->insn_cache);
	if (i != 0) {
		id = insns[i].mapid;
		switch(id) {
			default:
				return false;

			case X86_INS_MOVSB:
			case X86_INS_MOVSW:
			case X86_INS_MOVSQ:

			case X86_INS_LODSB:
			case X86_INS_LODSW:
			case X86_INS_LODSQ:

			case X86_INS_STOSB:
			case X86_INS_STOSW:
			case X86_INS_STOSQ:

			case X86_INS_INSB:
			case X86_INS_INSW:
			case X86_INS_INSD:

			case X86_INS_OUTSB:
			case X86_INS_OUTSW:
			case X86_INS_OUTSD:
				return true;

			// following are some confused instructions, which have the same
			// mnemonics in 128bit media instructions. Intel is horribly crazy!
			case X86_INS_MOVSD:
				if (opcode == X86_MOVSL) // REP MOVSD
					return true;
				return false;

			case X86_INS_LODSD:
				if (opcode == X86_LODSL) // REP LODSD
					return true;
				return false;

			case X86_INS_STOSD:
				if (opcode == X86_STOSL) // REP STOSD
					return true;
				return false;
		}
	}

	// not found
	return false;
}